

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.c
# Opt level: O3

void GradientUnfilter_C(uint8_t *prev,uint8_t *in,uint8_t *out,int width)

{
  ulong uVar1;
  uint8_t uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  
  if (prev == (uint8_t *)0x0) {
    if (0 < width) {
      uVar1 = 0;
      uVar2 = '\0';
      do {
        uVar2 = uVar2 + in[uVar1];
        out[uVar1] = uVar2;
        uVar1 = uVar1 + 1;
      } while ((uint)width != uVar1);
    }
  }
  else if (0 < width) {
    bVar3 = *prev;
    uVar1 = 0;
    uVar4 = (uint)bVar3;
    do {
      iVar5 = bVar3 - uVar4;
      uVar4 = (uint)prev[uVar1];
      iVar5 = iVar5 + uVar4;
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      if (0xfe < iVar5) {
        iVar5 = 0xff;
      }
      bVar3 = (char)iVar5 + in[uVar1];
      out[uVar1] = bVar3;
      uVar1 = uVar1 + 1;
    } while ((uint)width != uVar1);
  }
  return;
}

Assistant:

static void GradientUnfilter_C(const uint8_t* prev, const uint8_t* in,
                               uint8_t* out, int width) {
  if (prev == NULL) {
    HorizontalUnfilter_C(NULL, in, out, width);
  } else {
    uint8_t top = prev[0], top_left = top, left = top;
    int i;
    for (i = 0; i < width; ++i) {
      top = prev[i];  // need to read this first, in case prev==out
      left = (uint8_t)(in[i] + GradientPredictor_C(left, top, top_left));
      top_left = top;
      out[i] = left;
    }
  }
}